

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O1

Fl_Window * __thiscall Fl_Widget::top_window_offset(Fl_Widget *this,int *xoff,int *yoff)

{
  int iVar1;
  undefined4 extraout_var;
  Fl_Group *pFVar2;
  
  *yoff = 0;
  *xoff = 0;
  pFVar2 = (Fl_Group *)this;
  while (this = &((((Fl_Group *)this)->super_Fl_Widget).parent_)->super_Fl_Widget,
        (Fl_Group *)this != (Fl_Group *)0x0) {
    if (0xef < (((Fl_Group *)this)->super_Fl_Widget).type_) {
      if ((Fl_Group *)this == (Fl_Group *)0x0) break;
      *xoff = *xoff + (pFVar2->super_Fl_Widget).x_;
      *yoff = *yoff + (pFVar2->super_Fl_Widget).y_;
      this = &pFVar2->super_Fl_Widget;
      do {
        this = &((((Fl_Group *)this)->super_Fl_Widget).parent_)->super_Fl_Widget;
        pFVar2 = (Fl_Group *)this;
        if ((Fl_Group *)this == (Fl_Group *)0x0) goto LAB_001dd71c;
      } while ((((Fl_Group *)this)->super_Fl_Widget).type_ < 0xf0);
    }
  }
LAB_001dd71c:
  iVar1 = (*(pFVar2->super_Fl_Widget)._vptr_Fl_Widget[8])();
  return (Fl_Window *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Fl_Window* Fl_Widget::top_window_offset(int& xoff, int& yoff) const {
  xoff = yoff = 0;
  const Fl_Widget *w = this;
  while (w && w->window()) {
    xoff += w->x();			// accumulate offsets
    yoff += w->y();
    w = w->window();			// walk up window hierarchy
  }
  return const_cast<Fl_Widget*>(w)->as_window();
}